

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

void __thiscall
QHttp2Connection::registerStreamAsResetLocally(QHttp2Connection *this,quint32 streamID)

{
  QList<unsigned_int>::append((QList<unsigned_int> *)(this + 0x1d8),streamID);
  while (100 < *(ulong *)(this + 0x1e8)) {
    QList<unsigned_int>::takeFirst((QList<unsigned_int> *)(this + 0x1d8));
  }
  return;
}

Assistant:

void QHttp2Connection::registerStreamAsResetLocally(quint32 streamID)
{
    // RFC 9113, 6.4: However, after sending the RST_STREAM, the sending endpoint MUST be prepared
    // to receive and process additional frames sent on the stream that might have been sent by the
    // peer prior to the arrival of the RST_STREAM.

    // Store the last 100 stream ids that were reset locally. Frames received on these streams
    // are still considered valid for some time (Until 100 other streams are reset locally).
    m_resetStreamIDs.append(streamID);
    while (m_resetStreamIDs.size() > 100)
        m_resetStreamIDs.takeFirst();
}